

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

ostream * node::operator<<(ostream *os,BlockfileCursor *cursor)

{
  int *in_R8;
  long in_FS_OFFSET;
  string sStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<int,int>
            (&sStack_38,(tinyformat *)"BlockfileCursor(file_num=%d, undo_height=%d)",(char *)cursor,
             &cursor->undo_height,in_R8);
  std::operator<<(os,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BlockfileCursor& cursor) {
    os << strprintf("BlockfileCursor(file_num=%d, undo_height=%d)", cursor.file_num, cursor.undo_height);
    return os;
}